

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void burstsort2_sampling_vector(uchar **strings,size_t n)

{
  uchar *ptr;
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *root;
  undefined8 *puVar4;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this;
  ulong uVar5;
  pointer in_RCX;
  long lVar6;
  size_t depth;
  ulong uVar7;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"pseudo_sample");
  poVar3 = std::operator<<(poVar3,"(): sampling ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," strings ...\n");
  root = (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
         )operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar6 = 5000;
  for (uVar5 = 0; uVar5 < n; uVar5 = uVar5 + 0x2000) {
    ptr = strings[uVar5];
    depth = 0;
    this = root;
    while( true ) {
      bVar1 = get_char<unsigned_char>(ptr,depth);
      if (bVar1 == 0) break;
      TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::
      extend(this,bVar1 + 1);
      bVar2 = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
              ::is_trie(this,(uint)bVar1);
      if (!bVar2) {
        puVar4 = (undefined8 *)operator_new(0x18);
        *puVar4 = 0;
        puVar4[1] = 0;
        puVar4[2] = 0;
        in_RCX = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (ulong)((uint)bVar1 * 8);
        *(undefined8 **)((long)in_RCX + uVar7) = puVar4;
        make_trie((void **)(uVar7 + (long)(this->_buckets).
                                          super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start));
        lVar6 = lVar6 + -1;
        if (lVar6 == 0) goto LAB_001ef7a6;
      }
      this = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
             ::get_node(this,(uint)bVar1);
      depth = depth + 1;
      if (this == (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                   *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xd9,
                      "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = std::vector<unsigned char *>]"
                     );
      }
    }
  }
LAB_001ef7a6:
  insert<8192u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (root,strings,0,(_func_void_uchar_ptr_ptr_int_int *)in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_vector(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<8192, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}